

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O3

ares_bool_t opt_type_cb(char prefix,char *name,ares_bool_t is_true,char *value)

{
  int iVar1;
  undefined4 in_register_00000014;
  
  iVar1 = ares_dns_rec_type_fromstr(0x10a3f8,value,CONCAT44(in_register_00000014,is_true));
  if (iVar1 == 0) {
    snprintf(global_config.error,0x100,"unrecognized record type %s",value);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static ares_bool_t opt_type_cb(char prefix, const char *name,
                               ares_bool_t is_true, const char *value)
{
  (void)prefix;
  (void)name;
  (void)is_true;

  if (!ares_dns_rec_type_fromstr(&global_config.qtype, value)) {
    snprintf(global_config.error, sizeof(global_config.error),
             "unrecognized record type %s", value);
    return ARES_FALSE;
  }
  return ARES_TRUE;
}